

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O1

uint8_t * __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::Int64ToStringMap_MapEntry_DoNotUse,_google::protobuf::MessageLite,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9>
::_InternalSerialize
          (MapEntryImpl<CoreML::Specification::Int64ToStringMap_MapEntry_DoNotUse,_google::protobuf::MessageLite,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9>
           *this,uint8_t *ptr,EpsCopyOutputStream *stream)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  string *s;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint8_t *puVar6;
  undefined4 extraout_var_00;
  
  iVar2 = (*(this->super_MessageLite)._vptr_MessageLite[0xd])();
  if (stream->end_ <= ptr) {
    ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
  }
  uVar3 = *(ulong *)CONCAT44(extraout_var,iVar2);
  *ptr = '\b';
  ptr[1] = (byte)uVar3;
  if (uVar3 < 0x80) {
    puVar6 = ptr + 2;
  }
  else {
    ptr[1] = (byte)uVar3 | 0x80;
    ptr[2] = (uint8_t)(uVar3 >> 7);
    puVar6 = ptr + 3;
    if (0x3fff < uVar3) {
      uVar5 = (ulong)ptr[2];
      uVar3 = uVar3 >> 7;
      do {
        puVar6[-1] = (byte)uVar5 | 0x80;
        uVar4 = uVar3 >> 7;
        *puVar6 = (uint8_t)uVar4;
        puVar6 = puVar6 + 1;
        uVar5 = uVar4 & 0xffffffff;
        bVar1 = 0x3fff < uVar3;
        uVar3 = uVar4;
      } while (bVar1);
    }
  }
  iVar2 = (*(this->super_MessageLite)._vptr_MessageLite[0xe])(this);
  s = (string *)CONCAT44(extraout_var_00,iVar2);
  if (stream->end_ <= puVar6) {
    puVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar6);
  }
  __n = s->_M_string_length;
  if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)puVar6)))) {
    *puVar6 = '\x12';
    puVar6[1] = (uint8_t)__n;
    memcpy(puVar6 + 2,(s->_M_dataplus)._M_p,__n);
    return puVar6 + __n + 2;
  }
  puVar6 = io::EpsCopyOutputStream::WriteStringOutline(stream,2,s,puVar6);
  return puVar6;
}

Assistant:

::uint8_t* _InternalSerialize(
      ::uint8_t* ptr, io::EpsCopyOutputStream* stream) const override {
    ptr = KeyTypeHandler::Write(kKeyFieldNumber, key(), ptr, stream);
    return ValueTypeHandler::Write(kValueFieldNumber, value(), ptr, stream);
  }